

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeSequentialContainer<QList<TCBPoint>>(QDataStream *s,QList<TCBPoint> *c)

{
  bool bVar1;
  const_iterator o;
  QList<TCBPoint> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type *t;
  QList<TCBPoint> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  TCBPoint *in_stack_ffffffffffffffa8;
  QDataStream *stream;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  stream = in_RDI;
  QList<TCBPoint>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType((QDataStream *)in_stack_ffffffffffffffa8,0x719611);
  if (bVar1) {
    local_10.i = (TCBPoint *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<TCBPoint>::begin((QList<TCBPoint> *)stream);
    o = QList<TCBPoint>::end((QList<TCBPoint> *)stream);
    while (bVar1 = QList<TCBPoint>::const_iterator::operator!=(&local_10,o), bVar1) {
      QList<TCBPoint>::const_iterator::operator*(&local_10);
      ::operator<<(stream,in_stack_ffffffffffffffa8);
      QList<TCBPoint>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}